

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

token * get_next_token(Source_File *src,automata_entry *start_state,char skip_new_line)

{
  char cVar1;
  token *ptVar2;
  automata_entry *local_48;
  automata_entry *best_state;
  automata_entry *current_state;
  token *ret;
  char hold_char;
  int temp;
  char skip_new_line_local;
  automata_entry *start_state_local;
  Source_File *src_local;
  
  skip_white_space(src,skip_new_line);
  src_reset_token_data(src,'\x01');
  local_48 = start_state;
  best_state = start_state;
  while ((cVar1 = src_getc(src,'\x01','\0','\0'), cVar1 != '\0' &&
         ((cVar1 != '\n' || (skip_new_line != '\0'))))) {
    best_state = best_state->delta[cmpr[cVar1]];
    if (best_state == (automata_entry *)0x0) {
      if ((local_48->type != KW_COMMENT) && (local_48->type != PKW_COMMENT)) {
        ptVar2 = src_extract_token(src,local_48->type);
        return ptVar2;
      }
      src_reset_token_data(src,'\0');
      skip_white_space(src,'\x01');
      local_48 = start_state;
      best_state = start_state;
    }
    else if (best_state->is_final != '\0') {
      src_assimilate_into_best_token(src);
      local_48 = best_state;
    }
  }
  if ((local_48->type == KW_COMMENT) || (local_48->type == PKW_COMMENT)) {
    src_local = (Source_File *)src_extract_token(src,KW_NOTYPE);
  }
  else {
    src_local = (Source_File *)src_extract_token(src,local_48->type);
  }
  return (token *)src_local;
}

Assistant:

struct token* get_next_token(struct Source_File *src,struct automata_entry *start_state,char skip_new_line)
{
	int temp;
	char hold_char;

	struct token *ret;
	struct automata_entry *current_state;
	struct automata_entry *best_state;

	/*ignore leading spaces,tabs and newlines*/
	skip_white_space(src,skip_new_line);

	src_reset_token_data(src,1);

	best_state=current_state=start_state;


	while( (hold_char=src_getc(src,1,0,0)) !='\0')
	{
		if(hold_char=='\n' && !skip_new_line)
		{
			break;
		}
		current_state=current_state->delta[cmpr[hold_char]];
		if(current_state==NULL)
		{
			if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
			{
				/*TODO account for new lines not counted in comment*/
				src_reset_token_data(src,0);
				best_state=current_state=start_state;
				skip_white_space(src,1);
			}else
			{
				return src_extract_token(src,best_state->type);
			}

		}else
		{
			if(current_state->is_final)
			{
				best_state=current_state;
				src_assimilate_into_best_token(src);
			}
		}
	}

	if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
	{
		return src_extract_token(src,KW_NOTYPE);
	}else
	{
		return src_extract_token(src,best_state->type);
	}
	return ret;
}